

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  uint uVar2;
  uint32_t *local_920;
  uint32_t extra_bits_val;
  uint32_t rle_symbol;
  int use_rle;
  uint16_t bits [272];
  uint8_t depths [272];
  uint32_t histogram [272];
  size_t num_rle_symbols;
  uint32_t *puStack_188;
  uint32_t max_run_length_prefix;
  uint32_t *rle_symbols;
  size_t i;
  size_t *storage_ix_local;
  HuffmanTree *tree_local;
  size_t num_clusters_local;
  size_t context_map_size_local;
  uint32_t *context_map_local;
  MemoryManager *m_local;
  uint64_t v_4;
  uint8_t *p_4;
  size_t local_130;
  undefined8 local_128;
  undefined8 local_120;
  ulong local_118;
  uint64_t v_3;
  uint8_t *p_3;
  size_t local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  uint64_t v_2;
  uint8_t *p_2;
  size_t local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  uint64_t v_1;
  uint8_t *p_1;
  size_t local_a0;
  ulong local_98;
  undefined8 local_90;
  ulong local_88;
  uint64_t v;
  uint8_t *p;
  size_t local_70;
  long local_68;
  undefined8 local_60;
  ulong local_58;
  ulong *local_50;
  ulong local_48;
  ulong *local_40;
  ulong local_38;
  ulong *local_30;
  ulong local_28;
  ulong *local_20;
  MemoryManager *local_18;
  ulong *local_10;
  
  num_rle_symbols._4_4_ = 6;
  histogram[0x10e] = 0;
  histogram[0x10f] = 0;
  i = (size_t)storage_ix;
  storage_ix_local = (size_t *)tree;
  tree_local = (HuffmanTree *)num_clusters;
  num_clusters_local = context_map_size;
  context_map_size_local = (size_t)context_map;
  context_map_local = (uint32_t *)m;
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (tree_local != (HuffmanTree *)0x1) {
    if (num_clusters_local == 0) {
      local_920 = (uint32_t *)0x0;
    }
    else {
      local_920 = (uint32_t *)
                  BrotliAllocate((MemoryManager *)context_map_local,num_clusters_local << 2);
    }
    puStack_188 = local_920;
    MoveToFrontTransform((uint32_t *)context_map_size_local,num_clusters_local,local_920);
    RunLengthCodeZeros(num_clusters_local,puStack_188,(size_t *)(histogram + 0x10e),
                       (uint32_t *)((long)&num_rle_symbols + 4));
    memset(depths + 0x108,0,0x440);
    for (rle_symbols = (uint32_t *)0x0; rle_symbols < (ulong)histogram._1080_8_;
        rle_symbols = (uint32_t *)((long)rle_symbols + 1)) {
      histogram[(ulong)(puStack_188[(long)rle_symbols] & 0x1ff) - 2] =
           histogram[(ulong)(puStack_188[(long)rle_symbols] & 0x1ff) - 2] + 1;
    }
    local_68 = (long)(int)(uint)(num_rle_symbols._4_4_ != 0);
    local_60 = 1;
    local_70 = i;
    p = storage;
    v = (uint64_t)(storage + (*(ulong *)i >> 3));
    local_88 = local_68 << ((byte)*(undefined8 *)i & 7) | (ulong)(byte)*(ulong *)v;
    *(ulong *)v = local_88;
    *(long *)i = *(long *)i + 1;
    if ((num_rle_symbols._4_4_ != 0) != 0) {
      local_98 = (ulong)(num_rle_symbols._4_4_ - 1);
      local_90 = 4;
      local_a0 = i;
      p_1 = storage;
      v_1 = (uint64_t)(storage + (*(ulong *)i >> 3));
      local_b8 = local_98 << ((byte)*(undefined8 *)i & 7) | (ulong)(byte)*(ulong *)v_1;
      *(ulong *)v_1 = local_b8;
      *(long *)i = *(long *)i + 4;
      local_48 = local_b8;
      local_40 = (ulong *)v_1;
    }
    local_58 = local_88;
    local_50 = (ulong *)v;
    BuildAndStoreHuffmanTree
              ((uint32_t *)(depths + 0x108),
               (long)&tree_local->total_count_ + (ulong)num_rle_symbols._4_4_,
               (long)&tree_local->total_count_ + (ulong)num_rle_symbols._4_4_,
               (HuffmanTree *)storage_ix_local,(uint8_t *)(bits + 0x10c),(uint16_t *)&rle_symbol,
               (size_t *)i,storage);
    for (rle_symbols = (uint32_t *)0x0; rle_symbols < (ulong)histogram._1080_8_;
        rle_symbols = (uint32_t *)((long)rle_symbols + 1)) {
      uVar2 = puStack_188[(long)rle_symbols] & 0x1ff;
      uVar1 = puStack_188[(long)rle_symbols];
      local_c0 = (ulong)*(byte *)((long)bits + (ulong)uVar2 + 0x218);
      local_c8 = (ulong)*(ushort *)((long)&rle_symbol + (ulong)uVar2 * 2);
      local_d0 = i;
      p_2 = storage;
      v_2 = (uint64_t)(storage + (*(ulong *)i >> 3));
      local_e8 = local_c8 << ((byte)*(undefined8 *)i & 7) | (ulong)(byte)*(ulong *)v_2;
      local_30 = (ulong *)v_2;
      local_38 = local_e8;
      *(ulong *)v_2 = local_e8;
      *(ulong *)i = local_c0 + *(long *)i;
      if ((uVar2 != 0) && (uVar2 <= num_rle_symbols._4_4_)) {
        local_f0 = (ulong)uVar2;
        local_f8 = (ulong)(uVar1 >> 9);
        local_100 = i;
        p_3 = storage;
        v_3 = (uint64_t)(storage + (*(ulong *)i >> 3));
        local_118 = (ulong)(uVar1 >> 9) << ((byte)*(undefined8 *)i & 7) | (ulong)(byte)*(ulong *)v_3
        ;
        local_20 = (ulong *)v_3;
        local_28 = local_118;
        *(ulong *)v_3 = local_118;
        *(ulong *)i = (ulong)uVar2 + *(long *)i;
      }
    }
    local_120 = 1;
    local_128 = 1;
    local_130 = i;
    p_4 = storage;
    v_4 = (uint64_t)(storage + (*(ulong *)i >> 3));
    m_local = (MemoryManager *)(1L << ((byte)*(undefined8 *)i & 7) | (ulong)(byte)*(ulong *)v_4);
    *(MemoryManager **)v_4 = m_local;
    *(long *)i = *(long *)i + 1;
    local_18 = m_local;
    local_10 = (ulong *)v_4;
    BrotliFree((MemoryManager *)context_map_local,puStack_188);
  }
  return;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(rle_symbols)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}